

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuWorker.cpp
# Opt level: O2

void __thiscall xmrig::CpuWorker<1UL>::start(CpuWorker<1UL> *this)

{
  uint64_t *puVar1;
  byte bVar2;
  rep in_RAX;
  cn_hash_fun p_Var3;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  local_38.__r = in_RAX;
  do {
    if (Nonce::m_sequence == 0) {
      return;
    }
    if ((Nonce::m_paused & 1) != 0) {
      do {
        local_38.__r = 200;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
        if ((Nonce::m_paused & 1) == 0) break;
      } while (Nonce::m_sequence != 0);
      if (Nonce::m_sequence == 0) {
        return;
      }
      consumeJob(this);
    }
    while (Nonce::m_sequence == (this->m_job).m_sequence) {
      if (((this->super_Worker).m_count & 7) == 0) {
        Worker::storeStats(&this->super_Worker);
      }
      bVar2 = (this->m_job).m_index;
      p_Var3 = fn(this);
      (*p_Var3)((this->m_job).m_blobs[(this->m_job).m_index],(this->m_job).m_jobs[bVar2].m_size,
                this->m_hash,this->m_ctx,(this->m_job).m_jobs[bVar2].m_height,
                (this->m_job).m_jobs[bVar2].m_extraIters);
      if (*(ulong *)(this->m_hash + 0x18) < (this->m_job).m_jobs[bVar2].m_target) {
        JobResults::submit((this->m_job).m_jobs + bVar2,
                           *(uint32_t *)((this->m_job).m_blobs[(this->m_job).m_index] + 0x27),
                           this->m_hash);
      }
      WorkerJob<1UL>::nextRound(&this->m_job,0x8000,1);
      puVar1 = &(this->super_Worker).m_count;
      *puVar1 = *puVar1 + 1;
      sched_yield();
    }
    consumeJob(this);
  } while( true );
}

Assistant:

void xmrig::CpuWorker<N>::start()
{
    while (Nonce::sequence(Nonce::CPU) > 0) {
        if (Nonce::isPaused()) {
            do {
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
            }
            while (Nonce::isPaused() && Nonce::sequence(Nonce::CPU) > 0);

            if (Nonce::sequence(Nonce::CPU) == 0) {
                break;
            }

            consumeJob();
        }

        while (!Nonce::isOutdated(Nonce::CPU, m_job.sequence())) {
            if ((m_count & 0x7) == 0) {
                storeStats();
            }

            const Job &job = m_job.currentJob();

            fn()(m_job.blob(), job.size(), m_hash, m_ctx, job.height(), job.extraIters());

            for (size_t i = 0; i < N; ++i) {
                if (*reinterpret_cast<uint64_t*>(m_hash + (i * 32) + 24) < job.target()) {
                    JobResults::submit(job, *m_job.nonce(i), m_hash + (i * 32));
                }
            }

            m_job.nextRound(kReserveCount, 1);
            m_count += N;

            std::this_thread::yield();
        }

        consumeJob();
    }
}